

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O0

void __thiscall WhileLoopStatement::WhileLoopStatement(WhileLoopStatement *this)

{
  WhileLoopStatement *this_local;
  
  AnalysisInterface::AnalysisInterface(&this->super_AnalysisInterface);
  (this->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0020d6e0;
  Condition::Condition(&this->m_condition);
  std::__cxx11::string::string((string *)&this->m_top_label);
  std::__cxx11::string::string((string *)&this->m_bottom_label);
  return;
}

Assistant:

void LogOutput() {
        string str("This is a while loop statement");
        g_log_tools->GrammaNormalLogs(str);
    }